

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int fUseAll,int fDualOut)

{
  uint uVar1;
  int iLit0;
  int iLit1;
  Gia_Obj_t *pObj_00;
  
  pObj_00 = Gia_ManEquivRepr(p,pObj,fUseAll,fDualOut);
  if (pObj_00 == (Gia_Obj_t *)0x0) {
    if (pObj->Value != 0xffffffff) {
      return;
    }
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0x270,
                    "void Gia_ManEquivReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)");
    }
    Gia_ManEquivReduce_rec(pNew,p,pObj + -(ulong)uVar1,fUseAll,fDualOut);
    Gia_ManEquivReduce_rec
              (pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),fUseAll,fDualOut);
    iLit0 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    uVar1 = Gia_ManHashAnd(pNew,iLit0,iLit1);
  }
  else {
    Gia_ManEquivReduce_rec(pNew,p,pObj_00,fUseAll,fDualOut);
    uVar1 = Abc_LitNotCond(pObj_00->Value,
                           ((uint)pObj_00 ^ (uint)pObj) & 1 ^
                           (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f)
                           ^ (uint)((ulong)*(undefined8 *)((ulong)pObj_00 & 0xfffffffffffffffe) >>
                                   0x3f));
  }
  pObj->Value = uVar1;
  return;
}

Assistant:

void Gia_ManEquivReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int fUseAll, int fDualOut )
{
    Gia_Obj_t * pRepr;
    if ( (pRepr = Gia_ManEquivRepr(p, pObj, fUseAll, fDualOut)) )
    {
        Gia_ManEquivReduce_rec( pNew, p, pRepr, fUseAll, fDualOut );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManEquivReduce_rec( pNew, p, Gia_ObjFanin0(pObj), fUseAll, fDualOut );
    Gia_ManEquivReduce_rec( pNew, p, Gia_ObjFanin1(pObj), fUseAll, fDualOut );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}